

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall embree::TokenStream::decDigits1(TokenStream *this,string *str_o)

{
  int *piVar1;
  bool bVar2;
  string str;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = 0;
  bVar2 = false;
  while( true ) {
    piVar1 = Stream<int>::peek((this->cin).ptr);
    if (9 < *piVar1 - 0x30U) break;
    Stream<int>::get((this->cin).ptr);
    bVar2 = true;
    std::__cxx11::string::push_back((char)&local_40);
  }
  if (bVar2) {
    std::__cxx11::string::append((string *)str_o);
  }
  else {
    Stream<int>::unget((this->cin).ptr,local_38);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool TokenStream::decDigits1(std::string& str_o)
  {
    bool ok = false;
    std::string str;
    while (isDigit(cin->peek())) { ok = true; str += (char)cin->get(); }
    if (ok) str_o += str; else cin->unget(str.size());
    return ok;
  }